

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::ProductionSyntax::ProductionSyntax
          (ProductionSyntax *this,DataTypeSyntax *dataType,Token name,
          FunctionPortListSyntax *portList,Token colon,
          SeparatedSyntaxList<slang::syntax::RsRuleSyntax> *rules,Token semi)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  undefined4 uVar3;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar4;
  undefined8 uVar5;
  ulong uVar6;
  long lVar7;
  
  uVar5 = name._0_8_;
  (this->super_SyntaxNode).kind = Production;
  (this->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (this->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  this->dataType = dataType;
  (this->name).kind = (short)uVar5;
  (this->name).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->name).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->name).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->name).info = name.info;
  this->portList = portList;
  (this->colon).kind = colon.kind;
  (this->colon).field_0x2 = colon._2_1_;
  (this->colon).numFlags = (NumericTokenFlags)colon.numFlags.raw;
  (this->colon).rawLen = colon.rawLen;
  (this->colon).info = colon.info;
  uVar3 = *(undefined4 *)&(rules->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar1 = (rules->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->rules).super_SyntaxListBase.super_SyntaxNode.kind =
       (rules->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->rules).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->rules).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (this->rules).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (rules->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->rules).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005d2548;
  (this->rules).super_SyntaxListBase.childCount = (rules->super_SyntaxListBase).childCount;
  (this->rules).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005d6448;
  sVar2 = (rules->elements)._M_extent._M_extent_value;
  (this->rules).elements._M_ptr = (rules->elements)._M_ptr;
  (this->rules).elements._M_extent._M_extent_value = sVar2;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  if (dataType != (DataTypeSyntax *)0x0) {
    (dataType->super_ExpressionSyntax).super_SyntaxNode.parent = &this->super_SyntaxNode;
  }
  if (portList != (FunctionPortListSyntax *)0x0) {
    (portList->super_SyntaxNode).parent = &this->super_SyntaxNode;
  }
  (this->rules).super_SyntaxListBase.super_SyntaxNode.parent = &this->super_SyntaxNode;
  uVar6 = (this->rules).elements._M_extent._M_extent_value + 1;
  if (1 < uVar6) {
    uVar6 = uVar6 >> 1;
    lVar7 = 0;
    do {
      ppSVar4 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((this->rules).elements._M_ptr)->super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar7));
      (*ppSVar4)->parent = &this->super_SyntaxNode;
      lVar7 = lVar7 + 0x30;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

ProductionSyntax(DataTypeSyntax* dataType, Token name, FunctionPortListSyntax* portList, Token colon, const SeparatedSyntaxList<RsRuleSyntax>& rules, Token semi) :
        SyntaxNode(SyntaxKind::Production), dataType(dataType), name(name), portList(portList), colon(colon), rules(rules), semi(semi) {
        if (this->dataType) this->dataType->parent = this;
        if (this->portList) this->portList->parent = this;
        this->rules.parent = this;
        for (auto child : this->rules)
            child->parent = this;
    }